

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

_Bool import_encrypted_s(Filename *filename,BinarySource *src,int type,char **comment)

{
  char *pcVar1;
  char **comment_local;
  int type_local;
  BinarySource *src_local;
  Filename *filename_local;
  
  if (type == 5) {
    pcVar1 = filename_to_str(filename);
    pcVar1 = dupstr(pcVar1);
    *comment = pcVar1;
    filename_local._7_1_ = openssh_pem_encrypted(src);
  }
  else if (type == 6) {
    pcVar1 = filename_to_str(filename);
    pcVar1 = dupstr(pcVar1);
    *comment = pcVar1;
    filename_local._7_1_ = openssh_new_encrypted(src);
  }
  else if (type == 7) {
    filename_local._7_1_ = sshcom_encrypted(src,comment);
  }
  else {
    filename_local._7_1_ = false;
  }
  return filename_local._7_1_;
}

Assistant:

bool import_encrypted_s(const Filename *filename, BinarySource *src,
                        int type, char **comment)
{
    if (type == SSH_KEYTYPE_OPENSSH_PEM) {
        /* OpenSSH PEM format doesn't contain a key comment at all */
        *comment = dupstr(filename_to_str(filename));
        return openssh_pem_encrypted(src);
    } else if (type == SSH_KEYTYPE_OPENSSH_NEW) {
        /* OpenSSH new format does, but it's inside the encrypted
         * section for some reason */
        *comment = dupstr(filename_to_str(filename));
        return openssh_new_encrypted(src);
    } else if (type == SSH_KEYTYPE_SSHCOM) {
        return sshcom_encrypted(src, comment);
    }
    return false;
}